

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<std::pair<double,_QVariant>_>::reallocateAndGrow
          (QArrayDataPointer<std::pair<double,_QVariant>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<std::pair<double,_QVariant>_> *old)

{
  pair<double,_QVariant> *ppVar1;
  undefined8 *puVar2;
  Data *pDVar3;
  pair<double,_QVariant> *ppVar4;
  undefined1 *puVar5;
  bool bVar6;
  PrivateShared *pPVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  pair<double,_QVariant> *ppVar12;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<double,_QVariant>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<std::pair<double,_QVariant>_> *)0x0 && where == GrowsAtEnd) {
    pDVar3 = this->d;
    if (pDVar3 == (Data *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = 1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar6)) {
      if (pDVar3 == (Data *)0x0) {
        lVar10 = 0;
        lVar11 = 0;
      }
      else {
        lVar10 = (pDVar3->super_QArrayData).alloc;
        lVar11 = (this->size - (pDVar3->super_QArrayData).alloc) +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 3) * -0x3333333333333333;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QtPrivate::QMovableArrayOps<std::pair<double,_QVariant>_>::reallocate
                  ((QMovableArrayOps<std::pair<double,_QVariant>_> *)this,lVar10 + n + lVar11,Grow);
        return;
      }
      goto LAB_003be951;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (pair<double,_QVariant> *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  ppVar4 = local_48.ptr;
  if ((n < 1) || (local_48.ptr != (pair<double,_QVariant> *)0x0)) {
    if (this->size != 0) {
      lVar10 = this->size + (n >> 0x3f & n);
      if (this->d == (Data *)0x0) {
        bVar6 = true;
      }
      else {
        bVar6 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      }
      ppVar12 = this->ptr;
      ppVar1 = ppVar12 + lVar10;
      if ((old != (QArrayDataPointer<std::pair<double,_QVariant>_> *)0x0) || (bVar6)) {
        if ((lVar10 != 0) && (0 < lVar10)) {
          do {
            *(double *)((long)(&ppVar4[local_48.size].second + -1) + 0x18) = ppVar12->first;
            ::QVariant::QVariant(&ppVar4[local_48.size].second,&ppVar12->second);
            local_48.size = local_48.size + 1;
            ppVar12 = ppVar12 + 1;
          } while (ppVar12 < ppVar1);
        }
      }
      else if ((lVar10 != 0) && (0 < lVar10)) {
        do {
          local_48.ptr[local_48.size].first = ppVar12->first;
          pPVar7 = (ppVar12->second).d.data.shared;
          uVar8 = *(undefined8 *)((long)&(ppVar12->second).d.data + 8);
          uVar9 = *(undefined8 *)&(ppVar12->second).d.field_0x18;
          puVar2 = (undefined8 *)((long)&local_48.ptr[local_48.size].second.d.data + 0x10);
          *puVar2 = *(undefined8 *)((long)&(ppVar12->second).d.data + 0x10);
          puVar2[1] = uVar9;
          local_48.ptr[local_48.size].second.d.data.shared = pPVar7;
          *(undefined8 *)((long)&local_48.ptr[local_48.size].second.d.data + 8) = uVar8;
          (ppVar12->second).d.data.shared = (PrivateShared *)0x0;
          *(undefined8 *)((long)&(ppVar12->second).d.data + 8) = 0;
          *(undefined8 *)((long)&(ppVar12->second).d.data + 0x10) = 0;
          *(undefined8 *)&(ppVar12->second).d.field_0x18 = 2;
          ppVar12 = ppVar12 + 1;
          local_48.size = local_48.size + 1;
        } while (ppVar12 < ppVar1);
      }
    }
    pDVar3 = this->d;
    ppVar4 = this->ptr;
    this->d = local_48.d;
    this->ptr = local_48.ptr;
    puVar5 = (undefined1 *)this->size;
    this->size = local_48.size;
    local_48.d = pDVar3;
    local_48.ptr = ppVar4;
    local_48.size = (qsizetype)puVar5;
    if (old != (QArrayDataPointer<std::pair<double,_QVariant>_> *)0x0) {
      local_48.d = old->d;
      local_48.ptr = old->ptr;
      old->d = pDVar3;
      old->ptr = ppVar4;
      local_48.size = old->size;
      old->size = (qsizetype)puVar5;
    }
    ~QArrayDataPointer(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    qBadAlloc();
  }
LAB_003be951:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }